

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void init_client_web(int port,char *address)

{
  int iVar1;
  sockaddr_in web_addr;
  undefined4 auStack_7fc [499];
  code *pcStack_30;
  undefined1 local_20 [16];
  
  pcStack_30 = (code *)0x10d394;
  sock = socket(2,1,0);
  if (sock == -1) {
    pcStack_30 = (code *)0x10d3e4;
    init_client_web();
  }
  else {
    local_20._0_2_ = 2;
    local_20._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
    pcStack_30 = (code *)0x10d3ba;
    iVar1 = inet_aton(address,(in_addr *)(local_20 + 4));
    if (iVar1 != 0) {
      pcStack_30 = (code *)0x10d3d3;
      iVar1 = connect(sock,(sockaddr *)local_20,0x10);
      if (iVar1 != -1) {
        return;
      }
      goto LAB_0010d3e9;
    }
  }
  pcStack_30 = (code *)0x10d3e9;
  init_client_web();
LAB_0010d3e9:
  pcStack_30 = client_stop;
  init_client_web();
  if (sock != -1) {
    auStack_7fc[0] = 2;
    send(sock,auStack_7fc,0x7d4,0);
    shutdown(sock,2);
    close(sock);
    sock = -1;
  }
  return;
}

Assistant:

void init_client_web(int port, char*address){
    sock = socket(AF_INET,SOCK_STREAM,0);
    if(sock == -1){
        perror("Socket");
        exit(EXIT_FAILURE);
    }
    struct sockaddr_in web_addr;
    web_addr.sin_family = AF_INET;
    web_addr.sin_port = htons((uint16_t) port);

    if (inet_aton(address, &web_addr.sin_addr) == 0) {
        perror("inet_aton");
        exit(EXIT_FAILURE);
    }

    if(connect(sock,(struct sockaddr *)&web_addr,sizeof(web_addr)) == -1){
        perror("connect");
        exit(EXIT_FAILURE);
    }
}